

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void Prn_gen<unsigned_long>
               (int nbRn,pfHash hash,vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  code *in_RSI;
  int in_EDI;
  unsigned_long h;
  int i;
  unsigned_long hcopy;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffe0;
  
  printf("Generating %i random numbers : \n");
  memset(&stack0xffffffffffffffe0,0,8);
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    (*in_RSI)(&stack0xffffffffffffffe0,8,0,&local_30);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffffe0,
               (value_type_conflict2 *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    in_stack_ffffffffffffffe0 = local_30;
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}